

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

FileContainer_ptr __thiscall
filesystemcollection::getbyname(filesystemcollection *this,string *name)

{
  bool bVar1;
  pointer ppVar2;
  key_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  FileContainer_ptr FVar4;
  _Self local_30;
  _Self local_28;
  iterator i;
  string *name_local;
  filesystemcollection *this_local;
  
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FileContainer>,_caseinsensitive,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FileContainer>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FileContainer>,_caseinsensitive,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FileContainer>_>_>_>
               *)name,in_RDX);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FileContainer>,_caseinsensitive,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FileContainer>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FileContainer>,_caseinsensitive,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FileContainer>_>_>_>
              *)name);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    std::shared_ptr<FileContainer>::shared_ptr((shared_ptr<FileContainer> *)this);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FileContainer>_>_>
             ::operator->(&local_28);
    std::shared_ptr<FileContainer>::shared_ptr((shared_ptr<FileContainer> *)this,&ppVar2->second);
    _Var3._M_pi = extraout_RDX_00;
  }
  FVar4.super___shared_ptr<FileContainer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  FVar4.super___shared_ptr<FileContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (FileContainer_ptr)FVar4.super___shared_ptr<FileContainer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

FileContainer_ptr getbyname(const std::string& name)
    {
        auto i= _byname.find(name);
        if (i==_byname.end())
            return FileContainer_ptr();
        return i->second;
    }